

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O2

gradient_t * __thiscall tensor_t<gradient_t>::get(tensor_t<gradient_t> *this,int _x,int _y,int _z)

{
  int iVar1;
  int iVar2;
  uint __line;
  char *__assertion;
  
  if ((_y | _x | _z) < 0) {
    __assertion = "_x >= 0 && _y >= 0 && _z >= 0";
    __line = 0x31;
  }
  else {
    iVar1 = (this->size).x;
    if (((_x < iVar1) && (iVar2 = (this->size).y, _y < iVar2)) && (_z < (this->size).z)) {
      return (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
             super__Vector_impl_data._M_start + (uint)((iVar2 * _z + _y) * iVar1 + _x);
    }
    __assertion = "_x < size.x && _y < size.y && _z < size.z";
    __line = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/tensor_t.h"
                ,__line,"T &tensor_t<gradient_t>::get(int, int, int) [T = gradient_t]");
}

Assistant:

T &get(int _x, int _y, int _z) {
    assert(_x >= 0 && _y >= 0 && _z >= 0);
    assert(_x < size.x && _y < size.y && _z < size.z);

    return data[
        _z * (size.x * size.y) +
            _y * (size.x) +
            _x
    ];
  }